

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O2

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::EnumTypeInfo::Deserialize(EnumTypeInfo *this,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  PhysicalType PVar2;
  uint uVar3;
  unsigned_long size;
  InternalException *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar4;
  allocator local_49;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [4];
  
  size = Deserializer::ReadProperty<unsigned_long>(deserializer,200,"values_count");
  PVar2 = DictType(size);
  if (PVar2 == UINT32) {
    uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(size);
    EnumTypeInfoTemplated<unsigned_int>::Deserialize
              ((EnumTypeInfoTemplated<unsigned_int> *)local_48,deserializer,uVar3);
  }
  else if (PVar2 == UINT16) {
    uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(size);
    EnumTypeInfoTemplated<unsigned_short>::Deserialize
              ((EnumTypeInfoTemplated<unsigned_short> *)local_48,deserializer,uVar3);
  }
  else {
    if (PVar2 != UINT8) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)local_48,"Invalid Physical Type for ENUMs",&local_49)
      ;
      InternalException::InternalException(this_00,(string *)local_48);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(size);
    EnumTypeInfoTemplated<unsigned_char>::Deserialize
              ((EnumTypeInfoTemplated<unsigned_char> *)local_48,deserializer,uVar3);
  }
  _Var1._M_pi = a_Stack_40[0]._M_pi;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo = (_func_int **)local_48;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type = _Var1._M_pi;
  local_48 = (undefined1  [8])0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  sVar4.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar4.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> EnumTypeInfo::Deserialize(Deserializer &deserializer) {
	auto values_count = deserializer.ReadProperty<idx_t>(200, "values_count");
	auto enum_internal_type = EnumTypeInfo::DictType(values_count);
	switch (enum_internal_type) {
	case PhysicalType::UINT8:
		return EnumTypeInfoTemplated<uint8_t>::Deserialize(deserializer, NumericCast<uint32_t>(values_count));
	case PhysicalType::UINT16:
		return EnumTypeInfoTemplated<uint16_t>::Deserialize(deserializer, NumericCast<uint32_t>(values_count));
	case PhysicalType::UINT32:
		return EnumTypeInfoTemplated<uint32_t>::Deserialize(deserializer, NumericCast<uint32_t>(values_count));
	default:
		throw InternalException("Invalid Physical Type for ENUMs");
	}
}